

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

State * __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::pop(stack<c4::yml::Parser::State,_16UL> *this)

{
  code *pcVar1;
  bool bVar2;
  State *pSVar3;
  size_t sVar4;
  
  sVar4 = this->m_size;
  if (sVar4 == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pSVar3 = (State *)(*pcVar1)();
        return pSVar3;
      }
    }
    to_csubstr(
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              );
    (*(code *)PTR_error_impl_00231548)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
    sVar4 = this->m_size;
  }
  this->m_size = sVar4 - 1;
  return this->m_stack + (sVar4 - 1);
}

Assistant:

pop()
    {
        RYML_ASSERT(m_size > 0);
        --m_size;
        return m_stack[m_size];
    }